

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O3

char * spvGeneratorStr(uint32_t generator)

{
  undefined4 *puVar1;
  undefined *puVar2;
  ulong uVar3;
  
  uVar3 = 0xc;
  puVar2 = (undefined *)0x0;
  puVar1 = &(anonymous_namespace)::vendor_tools;
  do {
    if (*(uint32_t *)((long)&(anonymous_namespace)::vendor_tools + (long)puVar2) == generator)
    goto LAB_005e3f3b;
    if (*(uint32_t *)((long)&DAT_00b1fdb0 + (long)puVar2) == generator) {
      puVar2 = puVar2 + 0x20;
      goto LAB_005e3f3b;
    }
    if (*(uint32_t *)((long)&DAT_00b1fdd0 + (long)puVar2) == generator) {
      puVar2 = puVar2 + 0x40;
      goto LAB_005e3f3b;
    }
    if (*(uint32_t *)((long)&DAT_00b1fdf0 + (long)puVar2) == generator) {
      if (puVar2 == (undefined *)0x580) {
        return "Unknown";
      }
      puVar2 = (undefined *)((long)&DAT_00b1fdf0 + (long)puVar2);
      goto LAB_005e3f3e;
    }
    puVar2 = puVar2 + 0x80;
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  if (2 < generator - 0x2c) {
    return "Unknown";
  }
  puVar2 = &DAT_008da484;
  puVar1 = (undefined4 *)(long)*(int *)(&DAT_008da484 + (ulong)(generator - 0x2c) * 4);
LAB_005e3f3b:
  puVar2 = (undefined *)((long)puVar1 + (long)puVar2);
LAB_005e3f3e:
  return *(char **)(puVar2 + 0x18);
}

Assistant:

const char* spvGeneratorStr(uint32_t generator) {
  auto where = std::find_if(
      std::begin(vendor_tools), std::end(vendor_tools),
      [generator](const VendorTool& vt) { return generator == vt.value; });
  if (where != std::end(vendor_tools)) return where->vendor_tool;
  return "Unknown";
}